

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_meshb(REF_GRID ref_grid,char *filename)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  int iVar4;
  REF_STATUS RVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  REF_INT *pRVar10;
  int iVar11;
  int iVar12;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  double double_gref;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  uint local_200;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  long lStack_1e0;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  size_t sStack_1c8;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  size_t sStack_158;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  int ngeom;
  REF_INT geom;
  REF_INT n4;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT size_bytes;
  REF_INT i;
  REF_INT id;
  REF_INT type;
  REF_INT nodes [28];
  REF_INT cell;
  REF_INT node_per;
  REF_INT group;
  REF_INT node;
  REF_INT fp_size;
  REF_INT int_size;
  REF_INT header_size;
  REF_INT keyword_code;
  REF_FILEPOS next_position;
  int local_58;
  REF_INT dim;
  REF_INT version;
  REF_INT code;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  ref_cell = (REF_CELL)ref_grid->geom;
  next_position._4_4_ = 3;
  if (ref_grid->twod != 0) {
    next_position._4_4_ = 2;
  }
  local_58 = 2;
  if (ref_grid->meshb_version < 2) {
    if (10000000 < *(long *)&ref_geom->nnode) {
      local_58 = 3;
    }
    if (200000000 < *(long *)&ref_geom->nnode) {
      local_58 = 4;
    }
  }
  else {
    local_58 = ref_grid->meshb_version;
  }
  node = 4;
  group = 4;
  if (2 < local_58) {
    group = 8;
  }
  if (3 < local_58) {
    node = 8;
  }
  iVar4 = group + 4 + node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x79d,
           "ref_export_meshb","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    ref_private_status_reis_ai._0_4_ =
         ref_node_compact((REF_NODE)ref_geom,&n2o,(REF_INT **)&version);
    if ((uint)ref_private_status_reis_ai == 0) {
      dim = 1;
      ref_private_status_reis_bi = 1;
      ref_private_status_reis_ai_1 = fwrite(&dim,4,1,(FILE *)ref_node);
      if (ref_private_status_reis_bi == ref_private_status_reis_ai_1) {
        ref_private_status_reis_bi_1 = 1;
        ref_private_status_reis_ai_2 = fwrite(&local_58,4,1,(FILE *)ref_node);
        if (ref_private_status_reis_bi_1 == ref_private_status_reis_ai_2) {
          _header_size = ftell((FILE *)ref_node);
          _header_size = (group + 8) + _header_size;
          int_size = 3;
          ref_private_status_reis_bi_2 = 1;
          sStack_158 = fwrite(&int_size,4,1,(FILE *)ref_node);
          if (ref_private_status_reis_bi_2 == sStack_158) {
            ref_private_status_reis_ai_3._4_4_ =
                 ref_export_meshb_next_position((FILE *)ref_node,local_58,_header_size);
            if (ref_private_status_reis_ai_3._4_4_ == 0) {
              ref_private_status_reis_bi_3 = 1;
              ref_private_status_reis_ai_4 =
                   fwrite((void *)((long)&next_position + 4),4,1,(FILE *)ref_node);
              if (ref_private_status_reis_bi_3 == ref_private_status_reis_ai_4) {
                ref_private_status_reis_bi_4 = _header_size;
                ref_private_status_reis_ai_5 = ftell((FILE *)ref_node);
                if (ref_private_status_reis_bi_4 == ref_private_status_reis_ai_5) {
                  if (0 < ref_geom->n) {
                    iVar12 = ref_geom->n;
                    iVar11 = next_position._4_4_ * 8;
                    _header_size = ftell((FILE *)ref_node);
                    _header_size = (long)iVar4 + (long)iVar12 * (long)(iVar11 + node) + _header_size
                    ;
                    int_size = 4;
                    ref_private_status_reis_bi_5 = 1;
                    _ref_private_macro_code_rss_3 = fwrite(&int_size,4,1,(FILE *)ref_node);
                    if (ref_private_status_reis_bi_5 != _ref_private_macro_code_rss_3) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b1,"ref_export_meshb","vertex version code",
                             ref_private_status_reis_bi_5,_ref_private_macro_code_rss_3);
                      return 1;
                    }
                    ref_private_status_reis_ai_6._4_4_ =
                         ref_export_meshb_next_position((FILE *)ref_node,local_58,_header_size);
                    if (ref_private_status_reis_ai_6._4_4_ != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b2,"ref_export_meshb",(ulong)ref_private_status_reis_ai_6._4_4_,
                             "next p");
                      return ref_private_status_reis_ai_6._4_4_;
                    }
                    ref_private_status_reis_ai_6._0_4_ =
                         ref_export_meshb_int((FILE *)ref_node,local_58,ref_geom->n);
                    if ((uint)ref_private_status_reis_ai_6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b3,"ref_export_meshb",(ulong)(uint)ref_private_status_reis_ai_6,
                             "nnode");
                      return (uint)ref_private_status_reis_ai_6;
                    }
                    ref_private_status_reis_ai_6._0_4_ = 0;
                    for (node_per = 0; node_per < ref_geom->n; node_per = node_per + 1) {
                      ref_private_status_reis_bi_6 = 1;
                      ref_private_status_reis_ai_7 =
                           fwrite(ref_geom->face_seg_per_rad + _version[node_per] * 0xf,8,1,
                                  (FILE *)ref_node);
                      if (ref_private_status_reis_bi_6 != ref_private_status_reis_ai_7) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7b8,"ref_export_meshb","x",ref_private_status_reis_bi_6,
                               ref_private_status_reis_ai_7);
                        return 1;
                      }
                      ref_private_status_reis_bi_7 = 1;
                      ref_private_status_reis_ai_8 =
                           fwrite(ref_geom->face_seg_per_rad + (_version[node_per] * 0xf + 1),8,1,
                                  (FILE *)ref_node);
                      if (ref_private_status_reis_bi_7 != ref_private_status_reis_ai_8) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7bc,"ref_export_meshb","y",ref_private_status_reis_bi_7,
                               ref_private_status_reis_ai_8);
                        return 1;
                      }
                      if (*(int *)(filename_local + 0x108) == 0) {
                        ref_private_status_reis_bi_8 = 1;
                        sStack_1c8 = fwrite(ref_geom->face_seg_per_rad +
                                            (_version[node_per] * 0xf + 2),8,1,(FILE *)ref_node);
                        if (ref_private_status_reis_bi_8 != sStack_1c8) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7c1,"ref_export_meshb","z",ref_private_status_reis_bi_8,
                                 sStack_1c8);
                          return 1;
                        }
                      }
                      ref_private_status_reis_ai_9._4_4_ =
                           ref_export_meshb_int((FILE *)ref_node,local_58,1);
                      if (ref_private_status_reis_ai_9._4_4_ != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7c3,"ref_export_meshb",(ulong)ref_private_status_reis_ai_9._4_4_,
                               "nnode");
                        return ref_private_status_reis_ai_9._4_4_;
                      }
                      ref_private_status_reis_ai_9._4_4_ = 0;
                    }
                    ref_private_status_reis_bi_9 = _header_size;
                    lStack_1e0 = ftell((FILE *)ref_node);
                    if (ref_private_status_reis_bi_9 != lStack_1e0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7c5,"ref_export_meshb","vertex inconsistent",
                             ref_private_status_reis_bi_9,lStack_1e0);
                      return 1;
                    }
                  }
                  cell = 0;
                  o2n = *(REF_INT **)(filename_local + 0x10);
                  while (cell < 0x10) {
                    if (0 < o2n[10]) {
                      ref_private_status_reis_ai_10._4_4_ =
                           ref_cell_meshb_keyword((REF_CELL)o2n,&int_size);
                      if (ref_private_status_reis_ai_10._4_4_ != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7ca,"ref_export_meshb",(ulong)ref_private_status_reis_ai_10._4_4_,
                               "kw");
                        return ref_private_status_reis_ai_10._4_4_;
                      }
                      nodes[0x1b] = o2n[3];
                      lVar7 = ftell((FILE *)ref_node);
                      _header_size = lVar7 + iVar4 +
                                     (long)o2n[10] * (long)(node * (nodes[0x1b] + 1));
                      ref_private_status_reis_bi_10 = 1;
                      _ref_private_macro_code_rss_7 = fwrite(&int_size,4,1,(FILE *)ref_node);
                      if (ref_private_status_reis_bi_10 != _ref_private_macro_code_rss_7) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,1999,"ref_export_meshb","keyword code",ref_private_status_reis_bi_10
                               ,_ref_private_macro_code_rss_7);
                        return 1;
                      }
                      ref_private_macro_code_rss_8 =
                           ref_export_meshb_next_position((FILE *)ref_node,local_58,_header_size);
                      if (ref_private_macro_code_rss_8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,2000,"ref_export_meshb",(ulong)(uint)ref_private_macro_code_rss_8,
                               "next");
                        return ref_private_macro_code_rss_8;
                      }
                      local_200 = ref_export_meshb_int((FILE *)ref_node,local_58,o2n[10]);
                      if (local_200 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7d1,"ref_export_meshb",(ulong)local_200,"ncell");
                        return local_200;
                      }
                      local_200 = 0;
                      for (nodes[0x1a] = 0; nodes[0x1a] < o2n[0xb]; nodes[0x1a] = nodes[0x1a] + 1) {
                        RVar5 = ref_cell_nodes((REF_CELL)o2n,nodes[0x1a],&id);
                        if (RVar5 == 0) {
                          for (node_per = 0; RVar3 = nodes[0], RVar2 = type, node_per < nodes[0x1b];
                              node_per = node_per + 1) {
                            (&id)[node_per] = n2o[(&id)[node_per]] + 1;
                          }
                          if (*o2n == 9) {
                            n2 = id;
                            n3 = nodes[1];
                            n4 = nodes[2];
                            geom = type;
                            ngeom = nodes[0];
                            type = nodes[1];
                            nodes[0] = nodes[2];
                            nodes[1] = RVar2;
                            nodes[2] = RVar3;
                          }
                          if (o2n[1] == 0) {
                            (&id)[nodes[0x1b]] = 0;
                          }
                          for (node_per = 0; node_per < nodes[0x1b] + 1; node_per = node_per + 1) {
                            ref_private_status_reis_ai_11._4_4_ =
                                 ref_export_meshb_int((FILE *)ref_node,local_58,(&id)[node_per]);
                            if (ref_private_status_reis_ai_11._4_4_ != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x7e7,"ref_export_meshb",
                                     (ulong)ref_private_status_reis_ai_11._4_4_,"c2n");
                              return ref_private_status_reis_ai_11._4_4_;
                            }
                            ref_private_status_reis_ai_11._4_4_ = 0;
                          }
                        }
                      }
                      ref_private_status_reis_bi_11 = _header_size;
                      ref_private_status_reis_ai_12 = ftell((FILE *)ref_node);
                      if (ref_private_status_reis_bi_11 != ref_private_status_reis_ai_12) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7ea,"ref_export_meshb","cell inconsistent",
                               ref_private_status_reis_bi_11,ref_private_status_reis_ai_12);
                        return 1;
                      }
                    }
                    cell = cell + 1;
                    o2n = *(REF_INT **)(filename_local + (long)cell * 8 + 0x10);
                  }
                  for (i = 0; i < 3; i = i + 1) {
                    ref_private_status_reis_ai._4_4_ = 0;
                    for (ref_private_macro_code_rss = 0;
                        ref_private_macro_code_rss < ref_cell->last_node_is_an_id;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      if (i == *(int *)(*(long *)&ref_cell->edge_per +
                                       (long)(ref_private_macro_code_rss * 6) * 4)) {
                        ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1;
                      }
                    }
                    if (0 < ref_private_status_reis_ai._4_4_) {
                      int_size = i + 0x28;
                      lVar7 = ftell((FILE *)ref_node);
                      iVar12 = 0;
                      if (0 < i) {
                        iVar12 = 8;
                      }
                      _header_size = lVar7 + iVar4 +
                                     (long)ref_private_status_reis_ai._4_4_ *
                                     (long)(node * 2 + i * 8 + iVar12);
                      ref_private_status_reis_bi_12 = 1;
                      _ref_private_macro_code_rss_10 = fwrite(&int_size,4,1,(FILE *)ref_node);
                      if (ref_private_status_reis_bi_12 != _ref_private_macro_code_rss_10) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f7,"ref_export_meshb","keyword",ref_private_status_reis_bi_12,
                               _ref_private_macro_code_rss_10);
                        return 1;
                      }
                      ref_private_macro_code_rss_11 =
                           ref_export_meshb_next_position((FILE *)ref_node,local_58,_header_size);
                      if (ref_private_macro_code_rss_11 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f8,"ref_export_meshb",(ulong)(uint)ref_private_macro_code_rss_11,
                               "next");
                        return ref_private_macro_code_rss_11;
                      }
                      ref_private_macro_code_rss_12 =
                           ref_export_meshb_int
                                     ((FILE *)ref_node,local_58,ref_private_status_reis_ai._4_4_);
                      if (ref_private_macro_code_rss_12 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f9,"ref_export_meshb",(ulong)(uint)ref_private_macro_code_rss_12,
                               "ngeom");
                        return ref_private_macro_code_rss_12;
                      }
                      ref_private_macro_code_rss_12 = 0;
                      for (ref_private_macro_code_rss = 0; lVar7 = _header_size,
                          ref_private_macro_code_rss < ref_cell->last_node_is_an_id;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        if (i == *(int *)(*(long *)&ref_cell->edge_per +
                                         (long)(ref_private_macro_code_rss * 6) * 4)) {
                          size_bytes = *(REF_INT *)
                                        (*(long *)&ref_cell->edge_per +
                                        (long)(ref_private_macro_code_rss * 6 + 1) * 4);
                          ref_private_status_reis_ai_13._4_4_ =
                               ref_export_meshb_int
                                         ((FILE *)ref_node,local_58,
                                          n2o[*(int *)(*(long *)&ref_cell->edge_per +
                                                      (long)(ref_private_macro_code_rss * 6 + 5) * 4
                                                      )] + 1);
                          if (ref_private_status_reis_ai_13._4_4_ != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0x7fd,"ref_export_meshb",
                                   (ulong)ref_private_status_reis_ai_13._4_4_,"node");
                            return ref_private_status_reis_ai_13._4_4_;
                          }
                          ref_private_status_reis_ai_13._0_4_ =
                               ref_export_meshb_int((FILE *)ref_node,local_58,size_bytes);
                          if ((uint)ref_private_status_reis_ai_13 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0x7fe,"ref_export_meshb",
                                   (ulong)(uint)ref_private_status_reis_ai_13,"id");
                            return (uint)ref_private_status_reis_ai_13;
                          }
                          ref_private_status_reis_ai_13._0_4_ = 0;
                          for (n0 = 0; n0 < i; n0 = n0 + 1) {
                            ref_private_status_reis_bi_13 = 1;
                            double_gref = (double)fwrite(ref_cell->e2n +
                                                         (long)(n0 + ref_private_macro_code_rss * 2)
                                                         * 2,8,1,(FILE *)ref_node);
                            if ((double)ref_private_status_reis_bi_13 != double_gref) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x803,"ref_export_meshb","id",ref_private_status_reis_bi_13,
                                     double_gref);
                              return 1;
                            }
                          }
                          if (0 < i) {
                            ref_private_status_reis_ai_14 =
                                 (REF_LONG)
                                 (double)*(int *)(*(long *)&ref_cell->edge_per +
                                                 (long)(ref_private_macro_code_rss * 6 + 2) * 4);
                            sVar8 = fwrite(&ref_private_status_reis_ai_14,8,1,(FILE *)ref_node);
                            if (sVar8 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x806,"ref_export_meshb","gref",1,sVar8);
                              return 1;
                            }
                          }
                        }
                      }
                      lVar9 = ftell((FILE *)ref_node);
                      if (lVar7 != lVar9) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x809,"ref_export_meshb","geom inconsistent",lVar7,lVar9);
                        return 1;
                      }
                    }
                  }
                  if (ref_cell[2].c2n != (REF_INT *)0x0) {
                    int_size = 0x7e;
                    pRVar1 = ref_cell[2].c2n;
                    lVar7 = ftell((FILE *)ref_node);
                    _header_size = (long)pRVar1 + lVar7 + iVar4;
                    sVar8 = fwrite(&int_size,4,1,(FILE *)ref_node);
                    if (sVar8 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x811,"ref_export_meshb","keyword",1,sVar8);
                      return 1;
                    }
                    uVar6 = ref_export_meshb_next_position((FILE *)ref_node,local_58,_header_size);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x812,"ref_export_meshb",(ulong)uVar6,"next p");
                      return uVar6;
                    }
                    n1 = (REF_INT)ref_cell[2].c2n;
                    uVar6 = ref_export_meshb_int((FILE *)ref_node,local_58,n1);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x814,"ref_export_meshb",(ulong)uVar6,"size in bytes");
                      return uVar6;
                    }
                    pRVar1 = ref_cell[2].c2n;
                    pRVar10 = (REF_INT *)
                              fwrite(ref_cell[2].ref_adj,1,(size_t)ref_cell[2].c2n,(FILE *)ref_node)
                    ;
                    lVar7 = _header_size;
                    if (pRVar1 != pRVar10) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x818,"ref_export_meshb","node",pRVar1,pRVar10);
                      return 1;
                    }
                    lVar9 = ftell((FILE *)ref_node);
                    if (lVar7 != lVar9) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x819,"ref_export_meshb","cad_model inconsistent",lVar7,lVar9);
                      return 1;
                    }
                  }
                  int_size = 0x36;
                  sVar8 = fwrite(&int_size,4,1,(FILE *)ref_node);
                  if (sVar8 == 1) {
                    _header_size = 0;
                    uVar6 = ref_export_meshb_next_position((FILE *)ref_node,local_58,0);
                    if (uVar6 == 0) {
                      if (_version != (REF_INT *)0x0) {
                        free(_version);
                      }
                      if (n2o != (REF_INT *)0x0) {
                        free(n2o);
                      }
                      fclose((FILE *)ref_node);
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x820,"ref_export_meshb",(ulong)uVar6,"next p");
                      ref_grid_local._4_4_ = uVar6;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x81e,"ref_export_meshb","vertex version code",1,sVar8);
                    ref_grid_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x7a9,"ref_export_meshb","dim inconsistent",ref_private_status_reis_bi_4,
                         ref_private_status_reis_ai_5);
                  ref_grid_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x7a8,"ref_export_meshb","dim",ref_private_status_reis_bi_3,
                       ref_private_status_reis_ai_4);
                ref_grid_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x7a7,"ref_export_meshb",(ulong)ref_private_status_reis_ai_3._4_4_,"next pos")
              ;
              ref_grid_local._4_4_ = ref_private_status_reis_ai_3._4_4_;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x7a6,"ref_export_meshb","dim code",ref_private_status_reis_bi_2,sStack_158);
            ref_grid_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x7a3,"ref_export_meshb","version",ref_private_status_reis_bi_1,
                 ref_private_status_reis_ai_2);
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x7a2,"ref_export_meshb","code",ref_private_status_reis_bi,
               ref_private_status_reis_ai_1);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x79f,"ref_export_meshb",(ulong)(uint)ref_private_status_reis_ai,"compact");
      ref_grid_local._4_4_ = (uint)ref_private_status_reis_ai;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_meshb(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT *o2n, *n2o;
  REF_INT code, version, dim;
  REF_FILEPOS next_position;
  REF_INT keyword_code, header_size, int_size, fp_size;
  REF_INT node;
  REF_INT group, node_per, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT type, id, i, size_bytes;
  REF_INT n0, n1, n2, n3, n4;
  REF_INT geom;
  int ngeom;

  dim = 3;
  if (ref_grid_twod(ref_grid)) dim = 2;

  version = 2;
  if (1 < ref_grid_meshb_version(ref_grid)) {
    version = ref_grid_meshb_version(ref_grid);
  } else {
    if (REF_EXPORT_MESHB_VERTEX_3 < ref_node_n_global(ref_node)) version = 3;
    if (REF_EXPORT_MESHB_VERTEX_4 < ref_node_n_global(ref_node)) version = 4;
  }

  int_size = 4;
  fp_size = 4;
  if (2 < version) fp_size = 8;
  if (3 < version) int_size = 8;
  header_size = 4 + fp_size + int_size;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  code = 1;
  REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
  REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
  next_position = (REF_FILEPOS)(4 + fp_size + 4) + ftell(file);
  keyword_code = 3;
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
  RSS(ref_export_meshb_next_position(file, version, next_position), "next pos");
  REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
  REIS(next_position, ftell(file), "dim inconsistent");

  if (ref_node_n(ref_node) > 0) {
    next_position =
        (REF_FILEPOS)header_size +
        (REF_FILEPOS)ref_node_n(ref_node) * (REF_FILEPOS)(dim * 8 + int_size) +
        ftell(file);
    keyword_code = 4;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_export_meshb_int(file, version, ref_node_n(ref_node)), "nnode");
    for (node = 0; node < ref_node_n(ref_node); node++) {
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 0, n2o[node])), sizeof(double), 1,
                  file),
           "x");
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 1, n2o[node])), sizeof(double), 1,
                  file),
           "y");
      if (!ref_grid_twod(ref_grid))
        REIS(1,
             fwrite(&(ref_node_xyz(ref_node, 2, n2o[node])), sizeof(double), 1,
                    file),
             "z");
      RSS(ref_export_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
          "nnode");
    }
    REIS(next_position, ftell(file), "vertex inconsistent");
  }

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_cell_n(ref_cell) > 0) {
      RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
      node_per = ref_cell_node_per(ref_cell);
      next_position = ftell(file) + (REF_FILEPOS)header_size +
                      (REF_FILEPOS)ref_cell_n(ref_cell) *
                          (REF_FILEPOS)(int_size * (node_per + 1));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ref_cell_n(ref_cell)), "ncell");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[3];
          n2 = nodes[4];
          n3 = nodes[1];
          n4 = nodes[2];
          nodes[0] = n0;
          nodes[1] = n1;
          nodes[2] = n2;
          nodes[3] = n3;
          nodes[4] = n4;
        }
        if (!ref_cell_last_node_is_an_id(ref_cell))
          nodes[node_per] = REF_EXPORT_MESHB_3D_ID;
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_export_meshb_int(file, version, nodes[node]), "c2n");
        }
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    ngeom = 0;
    each_ref_geom_of(ref_geom, type, geom) ngeom++;
    if (ngeom > 0) {
      keyword_code = 40 + type; /* GmfVerticesOnGeometricVertices */
      next_position =
          ftell(file) + (REF_FILEPOS)header_size +
          (REF_FILEPOS)ngeom *
              (REF_FILEPOS)(int_size * 2 + 8 * type + (0 < type ? 8 : 0));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ngeom), "ngeom");
      each_ref_geom_of(ref_geom, type, geom) {
        node = o2n[ref_geom_node(ref_geom, geom)] + 1;
        id = ref_geom_id(ref_geom, geom);
        RSS(ref_export_meshb_int(file, version, node), "node");
        RSS(ref_export_meshb_int(file, version, id), "id");
        for (i = 0; i < type; i++)
          REIS(1,
               fwrite(&(ref_geom_param(ref_geom, i, geom)), sizeof(double), 1,
                      file),
               "id");
        if (0 < type) {
          double double_gref = (double)ref_geom_gref(ref_geom, geom);
          REIS(1, fwrite(&(double_gref), sizeof(double), 1, file), "gref");
        }
      }
      REIS(next_position, ftell(file), "geom inconsistent");
    }
  }

  if (0 < ref_geom_cad_data_size(ref_geom)) {
    keyword_code = 126; /* GmfByteFlow 173-47 */
    next_position = (REF_FILEPOS)header_size +
                    (REF_FILEPOS)ref_geom_cad_data_size(ref_geom) + ftell(file);
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    size_bytes = (REF_INT)ref_geom_cad_data_size(ref_geom);
    RSS(ref_export_meshb_int(file, version, size_bytes), "size in bytes");
    REIS(ref_geom_cad_data_size(ref_geom),
         fwrite(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                ref_geom_cad_data_size(ref_geom), file),
         "node");
    REIS(next_position, ftell(file), "cad_model inconsistent");
  }

  /* End */
  keyword_code = 54; /* GmfEnd 101-47 */
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
  next_position = 0;
  RSS(ref_export_meshb_next_position(file, version, next_position), "next p");

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}